

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O1

void absl::lts_20250127::cord_internal::CordzInfo::TrackCord
               (InlineData *cord,MethodIdentifier method,int64_t sampling_stride)

{
  CordzInfo *this;
  
  if (((cord->rep_).field_0.data[0] & 1U) == 0) {
    __assert_fail("cord.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                  ,0xfe,
                  "static void absl::cord_internal::CordzInfo::TrackCord(InlineData &, MethodIdentifier, int64_t)"
                 );
  }
  if ((cord->rep_).field_0.as_tree.cordz_info != 1) {
    __assert_fail("!cord.is_profiled()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                  ,0xff,
                  "static void absl::cord_internal::CordzInfo::TrackCord(InlineData &, MethodIdentifier, int64_t)"
                 );
  }
  this = (CordzInfo *)operator_new(0x540);
  if (((cord->rep_).field_0.data[0] & 1U) == 0) {
    __assert_fail("is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x274,"CordRep *absl::cord_internal::InlineData::as_tree() const");
  }
  CordzInfo(this,(cord->rep_).field_0.as_tree.rep,(CordzInfo *)0x0,method,sampling_stride);
  if (((cord->rep_).field_0.data[0] & 1U) != 0) {
    (cord->rep_).field_0.as_tree.cordz_info = (ulong)this | 1;
    Track(this);
    return;
  }
  __assert_fail("is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0x24d,"void absl::cord_internal::InlineData::set_cordz_info(CordzInfo *)");
}

Assistant:

void CordzInfo::TrackCord(InlineData& cord, MethodIdentifier method,
                          int64_t sampling_stride) {
  assert(cord.is_tree());
  assert(!cord.is_profiled());
  CordzInfo* cordz_info =
      new CordzInfo(cord.as_tree(), nullptr, method, sampling_stride);
  cord.set_cordz_info(cordz_info);
  cordz_info->Track();
}